

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetSuccessfulPayment(TgTypeParser *this,ptree *data)

{
  int iVar1;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  allocator local_71;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::make_shared<TgBot::SuccessfulPayment>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"currency",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_40,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_70);
  std::__cxx11::string::operator=(*(string **)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"total_amount",0x2e);
  iVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_70);
  *(int *)(*(long *)this + 0x20) = iVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"invoice_payload",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_40,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_70);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x28),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"shipping_option_id",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_40,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_70);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x48),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"order_info",&local_71);
  tryParseJson<TgBot::OrderInfo>
            ((TgTypeParser *)&local_40,(JsonToTgTypeFunc<TgBot::OrderInfo>)data,
             (ptree *)parseJsonAndGetOrderInfo,(string *)0x0);
  std::__shared_ptr<TgBot::OrderInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::OrderInfo,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x68),
             (__shared_ptr<TgBot::OrderInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  PVar2.super___shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SuccessfulPayment::Ptr TgTypeParser::parseJsonAndGetSuccessfulPayment(const boost::property_tree::ptree& data) const {
    auto result(make_shared<SuccessfulPayment>());
    result->currency = data.get<string>("currency");
    result->totalAmount = data.get<int32_t>("total_amount");
    result->invoicePayload = data.get<string>("invoice_payload");
    result->shippingOptionId = data.get<string>("shipping_option_id");
    result->orderInfo = tryParseJson(&TgTypeParser::parseJsonAndGetOrderInfo, data, "order_info");
    return result;
}